

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

int get_src_border_in_pixels(AV1_COMP *cpi,BLOCK_SIZE sb_size)

{
  _Bool _Var1;
  byte bVar2;
  uint uVar3;
  byte in_SIL;
  long in_RDI;
  int border_in_pixels;
  int border_pixels_height;
  int border_pixels_width;
  int sb_aligned_height;
  int sb_aligned_width;
  int sb_size_in_pixels_log2;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_4;
  
  if ((*(char *)(in_RDI + 0x42770) != '\x01') ||
     (_Var1 = av1_is_resize_needed((AV1EncoderConfig *)(in_RDI + 0x42320)), _Var1)) {
    local_4 = *(uint *)(in_RDI + 0x42724);
  }
  else {
    bVar2 = ""[in_SIL] + 2;
    uVar3 = ((*(int *)(in_RDI + 0x42338) + (1 << (bVar2 & 0x1f)) + -1 &
             ((1 << (bVar2 & 0x1f)) - 1U ^ 0xffffffff)) - *(int *)(in_RDI + 0x42338)) + 0x1f &
            0xffffffe0;
    local_34 = ((*(int *)(in_RDI + 0x4233c) + (1 << (bVar2 & 0x1f)) + -1 &
                ((1 << (bVar2 & 0x1f)) - 1U ^ 0xffffffff)) - *(int *)(in_RDI + 0x4233c)) + 0x1f &
               0xffffffe0;
    local_30 = local_34;
    if ((int)local_34 < (int)uVar3) {
      local_30 = uVar3;
    }
    if ((int)local_30 < 0x21) {
      local_38 = 0x20;
    }
    else {
      if ((int)local_34 < (int)uVar3) {
        local_34 = uVar3;
      }
      local_38 = local_34;
    }
    local_4 = local_38;
  }
  return local_4;
}

Assistant:

static inline int get_src_border_in_pixels(AV1_COMP *cpi, BLOCK_SIZE sb_size) {
  if (cpi->oxcf.mode != REALTIME || av1_is_resize_needed(&cpi->oxcf))
    return cpi->oxcf.border_in_pixels;

  const int sb_size_in_pixels_log2 = mi_size_wide_log2[sb_size] + MI_SIZE_LOG2;
  const int sb_aligned_width =
      ALIGN_POWER_OF_TWO(cpi->oxcf.frm_dim_cfg.width, sb_size_in_pixels_log2);
  const int sb_aligned_height =
      ALIGN_POWER_OF_TWO(cpi->oxcf.frm_dim_cfg.height, sb_size_in_pixels_log2);
  // Align the border pixels to a multiple of 32.
  const int border_pixels_width =
      ALIGN_POWER_OF_TWO(sb_aligned_width - cpi->oxcf.frm_dim_cfg.width, 5);
  const int border_pixels_height =
      ALIGN_POWER_OF_TWO(sb_aligned_height - cpi->oxcf.frm_dim_cfg.height, 5);
  const int border_in_pixels =
      AOMMAX(AOMMAX(border_pixels_width, border_pixels_height), 32);
  return border_in_pixels;
}